

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O2

void fs_event_cb_file(uv_fs_event_t *handle,char *filename,int events,int status)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  fs_event_cb_called = fs_event_cb_called + 1;
  if (handle == &fs_event) {
    if (status == 0) {
      if (events == 2) {
        iVar1 = strcmp(filename,"file2");
        if (iVar1 == 0) {
          iVar1 = uv_fs_event_stop(&fs_event);
          if (iVar1 == 0) {
            uv_close((uv_handle_t *)&fs_event,close_cb);
            return;
          }
          pcVar3 = "0 == uv_fs_event_stop(handle)";
          uVar2 = 0x14d;
        }
        else {
          pcVar3 = "strcmp(filename, \"file2\") == 0";
          uVar2 = 0x149;
        }
      }
      else {
        pcVar3 = "events == UV_CHANGE";
        uVar2 = 0x147;
      }
    }
    else {
      pcVar3 = "status == 0";
      uVar2 = 0x146;
    }
  }
  else {
    pcVar3 = "handle == &fs_event";
    uVar2 = 0x145;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-event.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void fs_event_cb_file(uv_fs_event_t* handle, const char* filename,
  int events, int status) {
  ++fs_event_cb_called;
  ASSERT(handle == &fs_event);
  ASSERT(status == 0);
  ASSERT(events == UV_CHANGE);
  #if defined(__APPLE__) || defined(_WIN32) || defined(__linux__)
  ASSERT(strcmp(filename, "file2") == 0);
  #else
  ASSERT(filename == NULL || strcmp(filename, "file2") == 0);
  #endif
  ASSERT(0 == uv_fs_event_stop(handle));
  uv_close((uv_handle_t*)handle, close_cb);
}